

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void operator_suite::less(void)

{
  bool bVar1;
  reference piVar2;
  initializer_list<int> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  circular_view<int,_18446744073709551615UL> local_78;
  basic_iterator<int> local_58;
  iterator_type local_48;
  iterator_type local_38;
  type local_28 [4];
  
  local_78.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_78.member.cap = 4;
  local_78.member.size = 0;
  local_78.member.next = 4;
  local_58.parent = (view_pointer)0x160000000b;
  local_58.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_58;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_78,input);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x524,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x525,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x526,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x527,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x528,"void operator_suite::less()",bVar1);
  local_48.current = local_78.member.cap * 2;
  if ((local_48.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_48.current - 1 & local_78.member.next;
    local_48.current = local_78.member.next - local_78.member.size & local_48.current - 1;
  }
  else {
    local_58.current = local_78.member.next % local_48.current;
    local_48.current = (local_78.member.next - local_78.member.size) % local_48.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52a,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52b,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52c,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52d,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52e,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_78,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_78);
  *piVar2 = 0x37;
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x531,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x532,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x533,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x534,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x535,"void operator_suite::less()",bVar1);
  local_48.current = local_78.member.cap * 2;
  if ((local_48.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_48.current - 1 & local_78.member.next;
    local_48.current = local_78.member.next - local_78.member.size & local_48.current - 1;
  }
  else {
    local_58.current = local_78.member.next % local_48.current;
    local_48.current = (local_78.member.next - local_78.member.size) % local_48.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x537,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x538,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x539,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53a,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53b,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_78,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_78);
  *piVar2 = 0x42;
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53e,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53f,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x540,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x541,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x542,"void operator_suite::less()",bVar1);
  local_48.current = local_78.member.cap * 2;
  if ((local_48.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_48.current - 1 & local_78.member.next;
    local_48.current = local_78.member.next - local_78.member.size & local_48.current - 1;
  }
  else {
    local_58.current = local_78.member.next % local_48.current;
    local_48.current = (local_78.member.next - local_78.member.size) % local_48.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x544,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x545,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x546,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x547,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x548,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_78,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_78);
  *piVar2 = 0x4d;
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54b,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54c,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54d,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54e,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54f,"void operator_suite::less()",bVar1);
  local_48.current = local_78.member.cap * 2;
  if ((local_48.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_48.current - 1 & local_78.member.next;
    local_48.current = local_78.member.next - local_78.member.size & local_48.current - 1;
  }
  else {
    local_58.current = local_78.member.next % local_48.current;
    local_48.current = (local_78.member.next - local_78.member.size) % local_48.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x551,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x552,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x553,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x554,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x555,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_78,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_78);
  *piVar2 = 0x58;
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x558,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x559,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55a,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55b,"void operator_suite::less()",bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_58.current - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  local_48.current = local_58.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55c,"void operator_suite::less()",bVar1);
  local_48.current = local_78.member.cap * 2;
  if ((local_48.current & local_78.member.cap * 2 - 1) == 0) {
    local_58.current = local_48.current - 1 & local_78.member.next;
    local_48.current = local_78.member.next - local_78.member.size & local_48.current - 1;
  }
  else {
    local_58.current = local_78.member.next % local_48.current;
    local_48.current = (local_78.member.next - local_78.member.size) % local_48.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_58,&local_48);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55e,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_58);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55f,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,2);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x560,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,3);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x561,"void operator_suite::less()",!bVar1);
  local_58.current = local_78.member.cap * 2;
  if ((local_58.current & local_78.member.cap * 2 - 1) == 0) {
    local_48.current = local_58.current - 1 & local_78.member.next;
    local_58.current = local_78.member.next - local_78.member.size & local_58.current - 1;
  }
  else {
    local_48.current = local_78.member.next % local_58.current;
    local_58.current = (local_78.member.next - local_78.member.size) % local_58.current;
  }
  local_58.parent = &local_78;
  local_48.parent = &local_78;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=(&local_58,4);
  local_38.parent = local_58.parent;
  local_38.current = local_58.current;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_48,&local_38);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x562,"void operator_suite::less()",!bVar1);
  return;
}

Assistant:

void less()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(55);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(66);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(77);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(88);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));
}